

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall
TApp_RequiredOptsUnlimitedShort_Test::TestBody(TApp_RequiredOptsUnlimitedShort_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  bool bVar1;
  Option *this_00;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5d8;
  AssertHelper local_598;
  Message local_590;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_583;
  undefined1 local_582;
  allocator local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  iterator local_558;
  size_type local_550;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_5;
  Message local_518;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50b;
  undefined1 local_50a;
  allocator local_509;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  iterator local_4e0;
  size_type local_4d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_4;
  string local_4a0;
  allocator local_479;
  string local_478;
  undefined1 local_458 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  remain;
  Message local_438;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_429;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_3;
  Message local_3d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c4;
  undefined1 local_3c3;
  allocator local_3c2;
  allocator local_3c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398 [32];
  iterator local_378;
  size_type local_370;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_2;
  Message local_338;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_32c;
  undefined1 local_32b;
  allocator local_32a;
  allocator local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300 [32];
  iterator local_2e0;
  size_type local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278 [32];
  string local_258 [32];
  iterator local_238;
  size_type local_230;
  AssertHelper local_228;
  Message local_220;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_214;
  undefined1 local_213;
  allocator local_212;
  allocator local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [32];
  iterator local_1c8;
  size_type local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  iterator local_100;
  size_type local_f8;
  AssertHelper local_f0;
  Message local_e8 [2];
  ArgumentMismatch *anon_var_0;
  char *pcStack_d0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  iterator local_98;
  size_type local_90;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  TApp_RequiredOptsUnlimitedShort_Test *this_local;
  
  strs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"-s",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"",&local_81);
  this_00 = CLI::App::add_option<std::__cxx11::string>
                      (&(this->super_TApp).app,&local_48,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_28,&local_80);
  CLI::OptionBase<CLI::Option>::required(&this_00->super_OptionBase<CLI::Option>,true);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"-s",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_98 = &local_b8;
  local_90 = 1;
  __l_06._M_len = 1;
  __l_06._M_array = local_98;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_06);
  local_5d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
  do {
    local_5d8 = local_5d8 + -1;
    std::__cxx11::string::~string((string *)local_5d8);
  } while (local_5d8 != &local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff30,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff30);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0012d4a0;
    pcStack_d0 = 
    "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x1ca,pcStack_d0);
  testing::internal::AssertHelper::operator=(&local_f0,local_e8);
  testing::internal::AssertHelper::~AssertHelper(&local_f0);
  testing::Message::~Message(local_e8);
LAB_0012d4a0:
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar.message_.ptr_._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_180,"-s",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"one",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"-s",(allocator *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"two",(allocator *)((long)&gtest_ar.message_.ptr_ + 4));
  gtest_ar.message_.ptr_._3_1_ = 0;
  local_100 = &local_180;
  local_f8 = 4;
  __l_05._M_len = 4;
  __l_05._M_array = local_100;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_05);
  local_660 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100;
  do {
    local_660 = local_660 + -1;
    std::__cxx11::string::~string((string *)local_660);
  } while (local_660 != &local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_213 = 1;
  local_210 = &local_208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"one",&local_211);
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"two",&local_212);
  local_213 = 0;
  local_1c8 = &local_208;
  local_1c0 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_214);
  __l_04._M_len = local_1c0;
  __l_04._M_array = local_1c8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b8,__l_04,&local_214);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_1a0,"strs","std::vector<std::string>({\"one\", \"two\"})",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,&local_1b8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_214);
  local_6a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8;
  do {
    local_6a0 = local_6a0 + -1;
    std::__cxx11::string::~string((string *)local_6a0);
  } while (local_6a0 != &local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_212);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x1cf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_ar_1.message_.ptr_._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_298,"-s",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"one",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"two",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 5));
  gtest_ar_1.message_.ptr_._4_1_ = 0;
  local_238 = &local_298;
  local_230 = 3;
  __l_03._M_len = 3;
  __l_03._M_array = local_238;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_03);
  local_748 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238;
  do {
    local_748 = local_748 + -1;
    std::__cxx11::string::~string((string *)local_748);
  } while (local_748 != &local_298);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_32b = 1;
  local_328 = &local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"one",&local_329);
  local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"two",&local_32a);
  local_32b = 0;
  local_2e0 = &local_320;
  local_2d8 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_32c);
  __l_02._M_len = local_2d8;
  __l_02._M_array = local_2e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2d0,__l_02,&local_32c);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_2b8,"strs","std::vector<std::string>({\"one\", \"two\"})",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,&local_2d0);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d0);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_32c);
  local_788 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e0;
  do {
    local_788 = local_788 + -1;
    std::__cxx11::string::~string((string *)local_788);
  } while (local_788 != &local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_32a);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x1d4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  CLI::App::reset(&(this->super_TApp).app);
  CLI::App::allow_extras(&(this->super_TApp).app,true);
  TApp::run(&this->super_TApp);
  local_3c3 = 1;
  local_3c0 = &local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"one",&local_3c1);
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"two",&local_3c2);
  local_3c3 = 0;
  local_378 = &local_3b8;
  local_370 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_3c4);
  __l_01._M_len = local_370;
  __l_01._M_array = local_378;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_368,__l_01,&local_3c4);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_350,"strs","std::vector<std::string>({\"one\", \"two\"})",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,&local_368);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_3c4);
  local_828 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_378;
  do {
    local_828 = local_828 + -1;
    std::__cxx11::string::~string((string *)local_828);
  } while (local_828 != &local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x1da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  CLI::App::remaining_abi_cxx11_(&local_400,&(this->super_TApp).app,false);
  CLI::std::
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::initializer_list(&local_428);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_429);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_418,local_428,&local_429);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_3e8,"app.remaining()","std::vector<std::string>({})",
             &local_400,&local_418);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_418);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_429);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &remain.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x1db,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &remain.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_438);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &remain.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  CLI::App::reset(&(this->super_TApp).app);
  CLI::App::allow_extras(&(this->super_TApp).app,false);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"positional",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4a0,"",(allocator *)((long)&gtest_ar_4.message_.ptr_ + 7));
  CLI::App::add_option<std::__cxx11::string>
            (&(this->super_TApp).app,&local_478,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_458,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  TApp::run(&this->super_TApp);
  local_50a = 1;
  local_508 = &local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_500,"one",&local_509);
  local_50a = 0;
  local_4e0 = &local_500;
  local_4d8 = 1;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_50b);
  __l_00._M_len = local_4d8;
  __l_00._M_array = local_4e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4d0,__l_00,&local_50b);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_4b8,"strs","std::vector<std::string>({\"one\"})",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28,&local_4d0);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4d0);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_50b);
  local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e0;
  do {
    local_8c0 = local_8c0 + -1;
    std::__cxx11::string::~string((string *)local_8c0);
  } while (local_8c0 != &local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x1e2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  local_582 = 1;
  local_580 = &local_578;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_578,"two",&local_581);
  local_582 = 0;
  local_558 = &local_578;
  local_550 = 1;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_583);
  __l._M_len = local_550;
  __l._M_array = local_558;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_548,__l,&local_583);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((EqHelper<false> *)local_530,"remain","std::vector<std::string>({\"two\"})",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_458,&local_548);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_548);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_583);
  local_928 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_558;
  do {
    local_928 = local_928 + -1;
    std::__cxx11::string::~string((string *)local_928);
  } while (local_928 != &local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x1e3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_458);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST_F(TApp, RequiredOptsUnlimitedShort) {

    std::vector<std::string> strs;
    app.add_option("-s", strs)->required();

    args = {"-s"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);

    app.reset();
    args = {"-s", "one", "-s", "two"};
    run();
    EXPECT_EQ(strs, std::vector<std::string>({"one", "two"}));

    app.reset();
    args = {"-s", "one", "two"};
    run();
    EXPECT_EQ(strs, std::vector<std::string>({"one", "two"}));

    // It's better to feed a hungry option than to feed allow_extras
    app.reset();
    app.allow_extras();
    run();
    EXPECT_EQ(strs, std::vector<std::string>({"one", "two"}));
    EXPECT_EQ(app.remaining(), std::vector<std::string>({}));

    app.reset();
    app.allow_extras(false);
    std::vector<std::string> remain;
    app.add_option("positional", remain);
    run();
    EXPECT_EQ(strs, std::vector<std::string>({"one"}));
    EXPECT_EQ(remain, std::vector<std::string>({"two"}));
}